

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O2

RDL_cycleIterator * RDL_getRCyclesIterator(RDL_data *data)

{
  RDL_cycleIterator *pRVar1;
  
  if (data != (RDL_data *)0x0) {
    pRVar1 = RDL_initCycleIterator(RDL_ALL_IT,0,0,0,0,0,data->bccGraphs->nof_bcc - 1,'b',data);
    return pRVar1;
  }
  (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
  return (RDL_cycleIterator *)0x0;
}

Assistant:

RDL_cycleIterator* RDL_getRCyclesIterator(const RDL_data *data)
{
  RDL_cycleIterator* it;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    return NULL;
  }

  it = RDL_initCycleIterator(
      RDL_ALL_IT,
      0, 0,
      0, 0,
      0, data->bccGraphs->nof_bcc-1,
      'b', data);

  return it;
}